

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.cpp
# Opt level: O0

void __thiscall wasm::analysis::CFGBlockIndexes::CFGBlockIndexes(CFGBlockIndexes *this,CFG *cfg)

{
  bool bVar1;
  Index IVar2;
  reference this_00;
  reference ppEVar3;
  mapped_type *pmVar4;
  Expression *local_68;
  Expression *expr;
  iterator __end3;
  iterator __begin3;
  BasicBlock *__range3;
  BasicBlock *block;
  iterator __end2;
  __normal_iterator<const_wasm::analysis::BasicBlock_*,_std::vector<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>_>
  local_28;
  iterator __begin2;
  CFG *__range2;
  CFG *cfg_local;
  CFGBlockIndexes *this_local;
  
  std::
  unordered_map<wasm::Expression_*,_unsigned_int,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_int>_>_>
  ::unordered_map(&this->map);
  __begin2._M_current = (BasicBlock *)cfg;
  local_28._M_current = (BasicBlock *)CFG::begin(cfg);
  block = (BasicBlock *)CFG::end(__begin2._M_current);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&local_28,
                       (__normal_iterator<const_wasm::analysis::BasicBlock_*,_std::vector<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>_>
                        *)&block);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_wasm::analysis::BasicBlock_*,_std::vector<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>_>
              ::operator*(&local_28);
    __end3 = analysis::BasicBlock::begin(this_00);
    expr = (Expression *)analysis::BasicBlock::end(this_00);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end3,(__normal_iterator<wasm::Expression_*const_*,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                                  *)&expr);
      if (!bVar1) break;
      ppEVar3 = __gnu_cxx::
                __normal_iterator<wasm::Expression_*const_*,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                ::operator*(&__end3);
      local_68 = *ppEVar3;
      IVar2 = analysis::BasicBlock::getIndex(this_00);
      pmVar4 = std::
               unordered_map<wasm::Expression_*,_unsigned_int,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_int>_>_>
               ::operator[](&this->map,&local_68);
      *pmVar4 = IVar2;
      __gnu_cxx::
      __normal_iterator<wasm::Expression_*const_*,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
      ::operator++(&__end3);
    }
    __gnu_cxx::
    __normal_iterator<const_wasm::analysis::BasicBlock_*,_std::vector<wasm::analysis::BasicBlock,_std::allocator<wasm::analysis::BasicBlock>_>_>
    ::operator++(&local_28);
  }
  return;
}

Assistant:

CFGBlockIndexes::CFGBlockIndexes(const CFG& cfg) {
  for (auto& block : cfg) {
    for (auto* expr : block) {
      map[expr] = block.getIndex();
    }
  }
}